

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stats.cc
# Opt level: O2

void WriteCountsWithImmediates(Stream *stream,OpcodeInfoCounts *counts)

{
  pointer ppVar1;
  vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
  *__range1;
  type *info;
  pointer this;
  vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
  sorted;
  vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
  local_38;
  
  local_38.
  super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.
  super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  copy_if<std::_Rb_tree_const_iterator<std::pair<wabt::OpcodeInfo_const,unsigned_long>>,std::back_insert_iterator<std::vector<std::pair<wabt::OpcodeInfo,unsigned_long>,std::allocator<std::pair<wabt::OpcodeInfo,unsigned_long>>>>,WithinCutoff<std::pair<wabt::OpcodeInfo,unsigned_long>>>
            ((counts->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             &(counts->_M_t)._M_impl.super__Rb_tree_header,&local_38);
  std::
  __stable_sort<__gnu_cxx::__normal_iterator<std::pair<wabt::OpcodeInfo,unsigned_long>*,std::vector<std::pair<wabt::OpcodeInfo,unsigned_long>,std::allocator<std::pair<wabt::OpcodeInfo,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<SortByCountDescending<std::pair<wabt::OpcodeInfo,unsigned_long>>>>
            (local_38.
             super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_38.
             super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  ppVar1 = local_38.
           super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this = local_38.
              super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start; this != ppVar1; this = this + 1) {
    wabt::OpcodeInfo::Write(&this->first,stream);
    wabt::Stream::Writef(stream,"%s%zd\n",s_separator,this->second);
  }
  std::
  vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
  ::~vector(&local_38);
  return;
}

Assistant:

void WriteCountsWithImmediates(Stream& stream, const OpcodeInfoCounts& counts) {
  // Remove const from the key type so we can sort below.
  using OpcodeInfoCountPair =
      std::pair<std::remove_const<OpcodeInfoCounts::key_type>::type,
                OpcodeInfoCounts::mapped_type>;

  std::vector<OpcodeInfoCountPair> sorted;
  std::copy_if(counts.begin(), counts.end(), std::back_inserter(sorted),
               WithinCutoff<OpcodeInfoCountPair>());

  // Use a stable sort to keep the elements with the same count in opcode info
  // order (since the OpcodeInfoCounts map is sorted).
  std::stable_sort(sorted.begin(), sorted.end(),
                   SortByCountDescending<OpcodeInfoCountPair>());

  for (auto& [info, count] : sorted) {
    info.Write(stream);
    stream.Writef("%s%" PRIzd "\n", s_separator, count);
  }
}